

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

void SNMPAgent::markTrapDeleted(SNMPTrap *trap)

{
  bool bVar1;
  reference ppSVar2;
  SNMPAgent *agent;
  iterator __end1;
  iterator __begin1;
  list<SNMPAgent_*,_std::allocator<SNMPAgent_*>_> *__range1;
  SNMPTrap *trap_local;
  
  __end1 = std::__cxx11::list<SNMPAgent_*,_std::allocator<SNMPAgent_*>_>::begin(&agents_abi_cxx11_);
  agent = (SNMPAgent *)
          std::__cxx11::list<SNMPAgent_*,_std::allocator<SNMPAgent_*>_>::end(&agents_abi_cxx11_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&agent);
    if (!bVar1) break;
    ppSVar2 = std::_List_iterator<SNMPAgent_*>::operator*(&__end1);
    mark_trap_deleted((list<InformItem_*,_std::allocator<InformItem_*>_> *)(*ppSVar2 + 0x648),trap);
    std::_List_iterator<SNMPAgent_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void SNMPAgent::markTrapDeleted(SNMPTrap* trap){
    for(auto agent : SNMPAgent::agents){
        mark_trap_deleted(agent->informList, trap);
    }
}